

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O3

void glob_cleanup(URLGlob *glob)

{
  char **__ptr;
  ulong uVar1;
  anon_union_24_3_e2f18bb4_for_content *paVar2;
  long lVar3;
  ulong uVar4;
  
  if (glob->size != 0) {
    uVar4 = glob->size - 1;
    do {
      uVar1 = uVar4 >> 1;
      if ((uVar4 & 1) == 0) {
        __ptr = (char **)glob->literal[uVar1];
        if (__ptr != (char **)0x0) {
          paVar2 = (anon_union_24_3_e2f18bb4_for_content *)(glob->literal + uVar1);
          goto LAB_001126af;
        }
      }
      else if (glob->pattern[uVar1].type == UPTSet) {
        __ptr = glob->pattern[uVar1].content.Set.elements;
        if (__ptr != (char **)0x0) {
          lVar3 = (long)glob->pattern[uVar1].content.Set.size;
          paVar2 = &glob->pattern[uVar1].content;
          if (0 < lVar3) {
            uVar1 = lVar3 + 1;
            do {
              if ((paVar2->Set).elements[uVar1 - 2] != (char *)0x0) {
                free((paVar2->Set).elements[uVar1 - 2]);
                (paVar2->Set).elements[uVar1 - 2] = (char *)0x0;
              }
              uVar1 = uVar1 - 1;
            } while (1 < uVar1);
            __ptr = (paVar2->Set).elements;
            if (__ptr == (char **)0x0) goto LAB_0011271a;
          }
LAB_001126af:
          free(__ptr);
          (paVar2->Set).elements = (char **)0x0;
        }
      }
LAB_0011271a:
      uVar4 = uVar4 - 1;
    } while (uVar4 < glob->size);
  }
  if (glob->glob_buffer != (char *)0x0) {
    free(glob->glob_buffer);
  }
  free(glob);
  return;
}

Assistant:

void glob_cleanup(URLGlob* glob)
{
  size_t i;
  int elem;

  for(i = glob->size - 1; i < glob->size; --i) {
    if(!(i & 1)) {     /* even indexes contain literals */
      Curl_safefree(glob->literal[i/2]);
    }
    else {              /* odd indexes contain sets or ranges */
      if((glob->pattern[i/2].type == UPTSet) &&
         (glob->pattern[i/2].content.Set.elements)) {
        for(elem = glob->pattern[i/2].content.Set.size - 1;
             elem >= 0;
             --elem) {
          Curl_safefree(glob->pattern[i/2].content.Set.elements[elem]);
        }
        Curl_safefree(glob->pattern[i/2].content.Set.elements);
      }
    }
  }
  Curl_safefree(glob->glob_buffer);
  Curl_safefree(glob);
}